

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,PropertyIdIndexType index)

{
  bool bVar1;
  undefined2 local_a [4];
  OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
     (local_a[0] = (undefined2)index, index < 0x10000)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,local_a,2,this);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootU(OpCode op, PropertyIdIndexType index)
    {
        OpLayoutT_ElementRootU<SizePolicy> layout;
        if (SizePolicy::Assign(layout.PropertyIdIndex, index))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }